

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

int __thiscall
google::protobuf::Reflection::FieldSize(Reflection *this,Message *message,FieldDescriptor *field)

{
  Descriptor *expected;
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  CppStringType CVar5;
  SooRep *this_00;
  MapFieldBase *this_01;
  RepeatedPtrFieldBase *pRVar6;
  char *description;
  Metadata MVar7;
  LogMessage LStack_28;
  
  MVar7 = Message::GetMetadata(message);
  if (MVar7.reflection != this) {
LAB_002541d2:
    expected = this->descriptor_;
    MVar7 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(expected,MVar7.descriptor,field,"FieldSize");
  }
  if (field->containing_type_ != this->descriptor_) {
    description = "Field does not match message type.";
LAB_00254210:
    anon_unknown_6::ReportReflectionUsageError(this->descriptor_,field,"FieldSize",description);
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    FieldSize();
    goto LAB_002541d2;
  }
  if ((bVar1 & 0x20) == 0) {
    description = "Field is singular; the method requires a repeated field.";
    goto LAB_00254210;
  }
  if ((bVar1 & 8) != 0) {
    uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    iVar4 = internal::ExtensionSet::ExtensionSize
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                       field->number_);
    return iVar4;
  }
  bVar1 = field->type_;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
  case 8:
    this_00 = &GetRaw<google::protobuf::RepeatedField<int>>(this,message,field)->soo_rep_;
    break;
  case 2:
    this_00 = &GetRaw<google::protobuf::RepeatedField<long>>(this,message,field)->soo_rep_;
    break;
  case 3:
    this_00 = &GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field)->soo_rep_;
    break;
  case 4:
    this_00 = &GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field)->soo_rep_;
    break;
  case 5:
    this_00 = &GetRaw<google::protobuf::RepeatedField<double>>(this,message,field)->soo_rep_;
    break;
  case 6:
    this_00 = &GetRaw<google::protobuf::RepeatedField<float>>(this,message,field)->soo_rep_;
    break;
  case 7:
    this_00 = &GetRaw<google::protobuf::RepeatedField<bool>>(this,message,field)->soo_rep_;
    break;
  case 9:
    CVar5 = FieldDescriptor::cpp_string_type(field);
    if (CVar5 != kCord) {
      bVar1 = field->type_;
      goto switchD_00254065_caseD_a;
    }
    this_00 = &GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(this,message,field)
               ->soo_rep_;
    break;
  case 10:
switchD_00254065_caseD_a:
    if ((bVar1 == 0xb) && (bVar2 = FieldDescriptor::is_map_message_type(field), bVar2)) {
      this_01 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      bVar2 = internal::MapFieldBase::IsRepeatedFieldValid(this_01);
      if (!bVar2) {
        iVar4 = internal::MapFieldBase::size(this_01);
        return iVar4;
      }
      pRVar6 = internal::MapFieldBase::GetRepeatedField(this_01);
    }
    else {
      pRVar6 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
    }
    return pRVar6->current_size_;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x5ab);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_28,(char (*) [16])"Can\'t get here.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_28);
  }
  iVar4 = internal::SooRep::size
                    (this_00,(undefined1  [16])
                             ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
  return iVar4;
}

Assistant:

int Reflection::FieldSize(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(FieldSize, &message);
  USAGE_CHECK_MESSAGE_TYPE(FieldSize);
  USAGE_CHECK_REPEATED(FieldSize);

  if (field->is_extension()) {
    return GetExtensionSet(message).ExtensionSize(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)    \
  case FieldDescriptor::CPPTYPE_##UPPERCASE: \
    return GetRaw<RepeatedField<LOWERCASE> >(message, field).size()

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          return GetRaw<RepeatedField<absl::Cord> >(message, field).size();
        }
        ABSL_FALLTHROUGH_INTENDED;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          const internal::MapFieldBase& map =
              GetRaw<MapFieldBase>(message, field);
          if (map.IsRepeatedFieldValid()) {
            return map.GetRepeatedField().size();
          } else {
            // No need to materialize the repeated field if it is out of sync:
            // its size will be the same as the map's size.
            return map.size();
          }
        } else {
          return GetRaw<RepeatedPtrFieldBase>(message, field).size();
        }
    }

    ABSL_LOG(FATAL) << "Can't get here.";
    return 0;
  }
}